

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O1

void stbir__resample_horizontal_upsample(stbir__info *stbir_info,float *output_buffer)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  float *pfVar8;
  stbir__contributors *psVar9;
  float *pfVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  float *pfVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  float *pfVar19;
  long lVar20;
  float *pfVar21;
  long lVar22;
  
  iVar2 = stbir_info->output_w;
  if (0 < (long)iVar2) {
    uVar3 = stbir_info->channels;
    lVar16 = (long)(int)uVar3;
    iVar4 = stbir_info->horizontal_filter_pixel_margin;
    pfVar8 = stbir_info->decode_buffer;
    lVar13 = (long)(int)(iVar4 * uVar3);
    psVar9 = stbir_info->horizontal_contributors;
    pfVar10 = stbir_info->horizontal_coefficients;
    iVar5 = stbir_info->horizontal_coefficient_width;
    lVar22 = 0;
    pfVar19 = output_buffer;
    pfVar21 = pfVar10;
    do {
      iVar6 = psVar9[lVar22].n0;
      lVar20 = (long)iVar6;
      iVar7 = psVar9[lVar22].n1;
      if (iVar7 < iVar6) {
        __assert_fail("n1 >= n0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                      ,0x5b5,"void stbir__resample_horizontal_upsample(stbir__info *, float *)");
      }
      if (SBORROW4(iVar6,-iVar4) != iVar6 + iVar4 < 0) {
        __assert_fail("n0 >= -stbir_info->horizontal_filter_pixel_margin",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                      ,0x5b6,"void stbir__resample_horizontal_upsample(stbir__info *, float *)");
      }
      if (SBORROW4(iVar7,-iVar4) != iVar7 + iVar4 < 0) {
        __assert_fail("n1 >= -stbir_info->horizontal_filter_pixel_margin",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                      ,0x5b7,"void stbir__resample_horizontal_upsample(stbir__info *, float *)");
      }
      iVar12 = stbir_info->input_w + iVar4;
      if (iVar12 <= iVar6) {
        __assert_fail("n0 < stbir_info->input_w + stbir_info->horizontal_filter_pixel_margin",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                      ,0x5b8,"void stbir__resample_horizontal_upsample(stbir__info *, float *)");
      }
      if (iVar12 <= iVar7) {
        __assert_fail("n1 < stbir_info->input_w + stbir_info->horizontal_filter_pixel_margin",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                      ,0x5b9,"void stbir__resample_horizontal_upsample(stbir__info *, float *)");
      }
      if (uVar3 - 1 < 4) {
        lVar18 = lVar22 * lVar16;
        switch(uVar3) {
        case 1:
          if (iVar6 <= iVar7) {
            uVar15 = 0;
            do {
              fVar1 = pfVar21[uVar15];
              if ((fVar1 == 0.0) && (!NAN(fVar1))) {
                __assert_fail("coefficient != 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                              ,0x5c1,
                              "void stbir__resample_horizontal_upsample(stbir__info *, float *)");
              }
              lVar11 = lVar20 + uVar15;
              uVar15 = uVar15 + 1;
              output_buffer[lVar18] = fVar1 * pfVar8[lVar13 + lVar11] + output_buffer[lVar18];
            } while ((iVar7 - iVar6) + 1 != uVar15);
          }
          break;
        case 2:
          if (iVar6 <= iVar7) {
            uVar15 = 0;
            do {
              fVar1 = pfVar21[uVar15];
              if ((fVar1 == 0.0) && (!NAN(fVar1))) {
                __assert_fail("coefficient != 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                              ,0x5ca,
                              "void stbir__resample_horizontal_upsample(stbir__info *, float *)");
              }
              output_buffer[lVar18] =
                   pfVar8[lVar13 + lVar20 * 2 + uVar15 * 2] * fVar1 + output_buffer[lVar18];
              lVar11 = uVar15 * 2;
              uVar15 = uVar15 + 1;
              output_buffer[lVar18 + 1] =
                   fVar1 * pfVar8[lVar13 + lVar20 * 2 + lVar11 + 1] + output_buffer[lVar18 + 1];
            } while ((iVar7 - iVar6) + 1 != uVar15);
          }
          break;
        case 3:
          if (iVar6 <= iVar7) {
            pfVar14 = pfVar8 + lVar13 + lVar20 * 3 + 2;
            uVar15 = 0;
            do {
              fVar1 = pfVar21[uVar15];
              if ((fVar1 == 0.0) && (!NAN(fVar1))) {
                __assert_fail("coefficient != 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                              ,0x5d4,
                              "void stbir__resample_horizontal_upsample(stbir__info *, float *)");
              }
              output_buffer[lVar18] = pfVar14[-2] * fVar1 + output_buffer[lVar18];
              output_buffer[lVar18 + 1] = pfVar14[-1] * fVar1 + output_buffer[lVar18 + 1];
              uVar15 = uVar15 + 1;
              output_buffer[lVar18 + 2] = fVar1 * *pfVar14 + output_buffer[lVar18 + 2];
              pfVar14 = pfVar14 + 3;
            } while ((iVar7 - iVar6) + 1 != uVar15);
          }
          break;
        case 4:
          if (iVar6 <= iVar7) {
            pfVar14 = pfVar8 + lVar13 + lVar20 * 4 + 3;
            uVar15 = 0;
            do {
              fVar1 = pfVar21[uVar15];
              if ((fVar1 == 0.0) && (!NAN(fVar1))) {
                __assert_fail("coefficient != 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                              ,0x5df,
                              "void stbir__resample_horizontal_upsample(stbir__info *, float *)");
              }
              output_buffer[lVar18] = pfVar14[-3] * fVar1 + output_buffer[lVar18];
              output_buffer[lVar18 + 1] = pfVar14[-2] * fVar1 + output_buffer[lVar18 + 1];
              output_buffer[lVar18 + 2] = pfVar14[-1] * fVar1 + output_buffer[lVar18 + 2];
              uVar15 = uVar15 + 1;
              output_buffer[lVar18 + 3] = fVar1 * *pfVar14 + output_buffer[lVar18 + 3];
              pfVar14 = pfVar14 + 4;
            } while ((iVar7 - iVar6) + 1 != uVar15);
          }
        }
      }
      else if (iVar6 <= iVar7) {
        lVar20 = (long)pfVar8 + lVar20 * lVar16 * 4 + lVar13 * 4;
        uVar15 = 0;
        do {
          fVar1 = pfVar10[lVar22 * iVar5 + uVar15];
          if ((fVar1 == 0.0) && (!NAN(fVar1))) {
            __assert_fail("coefficient != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                          ,0x5ec,"void stbir__resample_horizontal_upsample(stbir__info *, float *)")
            ;
          }
          if (0 < (int)uVar3) {
            uVar17 = 0;
            do {
              pfVar19[uVar17] = *(float *)(lVar20 + uVar17 * 4) * fVar1 + pfVar19[uVar17];
              uVar17 = uVar17 + 1;
            } while (uVar3 != uVar17);
          }
          uVar15 = uVar15 + 1;
          lVar20 = lVar20 + lVar16 * 4;
        } while (uVar15 != (iVar7 - iVar6) + 1);
      }
      lVar22 = lVar22 + 1;
      pfVar21 = pfVar21 + iVar5;
      pfVar19 = pfVar19 + lVar16;
    } while (lVar22 != iVar2);
  }
  return;
}

Assistant:

static void stbir__resample_horizontal_upsample(stbir__info* stbir_info, float* output_buffer)
{
    int x, k;
    int output_w = stbir_info->output_w;
    int channels = stbir_info->channels;
    float* decode_buffer = stbir__get_decode_buffer(stbir_info);
    stbir__contributors* horizontal_contributors = stbir_info->horizontal_contributors;
    float* horizontal_coefficients = stbir_info->horizontal_coefficients;
    int coefficient_width = stbir_info->horizontal_coefficient_width;

    for (x = 0; x < output_w; x++)
    {
        int n0 = horizontal_contributors[x].n0;
        int n1 = horizontal_contributors[x].n1;

        int out_pixel_index = x * channels;
        int coefficient_group = coefficient_width * x;
        int coefficient_counter = 0;

        STBIR_ASSERT(n1 >= n0);
        STBIR_ASSERT(n0 >= -stbir_info->horizontal_filter_pixel_margin);
        STBIR_ASSERT(n1 >= -stbir_info->horizontal_filter_pixel_margin);
        STBIR_ASSERT(n0 < stbir_info->input_w + stbir_info->horizontal_filter_pixel_margin);
        STBIR_ASSERT(n1 < stbir_info->input_w + stbir_info->horizontal_filter_pixel_margin);

        switch (channels) {
            case 1:
                for (k = n0; k <= n1; k++)
                {
                    int in_pixel_index = k * 1;
                    float coefficient = horizontal_coefficients[coefficient_group + coefficient_counter++];
                    STBIR_ASSERT(coefficient != 0);
                    output_buffer[out_pixel_index + 0] += decode_buffer[in_pixel_index + 0] * coefficient;
                }
                break;
            case 2:
                for (k = n0; k <= n1; k++)
                {
                    int in_pixel_index = k * 2;
                    float coefficient = horizontal_coefficients[coefficient_group + coefficient_counter++];
                    STBIR_ASSERT(coefficient != 0);
                    output_buffer[out_pixel_index + 0] += decode_buffer[in_pixel_index + 0] * coefficient;
                    output_buffer[out_pixel_index + 1] += decode_buffer[in_pixel_index + 1] * coefficient;
                }
                break;
            case 3:
                for (k = n0; k <= n1; k++)
                {
                    int in_pixel_index = k * 3;
                    float coefficient = horizontal_coefficients[coefficient_group + coefficient_counter++];
                    STBIR_ASSERT(coefficient != 0);
                    output_buffer[out_pixel_index + 0] += decode_buffer[in_pixel_index + 0] * coefficient;
                    output_buffer[out_pixel_index + 1] += decode_buffer[in_pixel_index + 1] * coefficient;
                    output_buffer[out_pixel_index + 2] += decode_buffer[in_pixel_index + 2] * coefficient;
                }
                break;
            case 4:
                for (k = n0; k <= n1; k++)
                {
                    int in_pixel_index = k * 4;
                    float coefficient = horizontal_coefficients[coefficient_group + coefficient_counter++];
                    STBIR_ASSERT(coefficient != 0);
                    output_buffer[out_pixel_index + 0] += decode_buffer[in_pixel_index + 0] * coefficient;
                    output_buffer[out_pixel_index + 1] += decode_buffer[in_pixel_index + 1] * coefficient;
                    output_buffer[out_pixel_index + 2] += decode_buffer[in_pixel_index + 2] * coefficient;
                    output_buffer[out_pixel_index + 3] += decode_buffer[in_pixel_index + 3] * coefficient;
                }
                break;
            default:
                for (k = n0; k <= n1; k++)
                {
                    int in_pixel_index = k * channels;
                    float coefficient = horizontal_coefficients[coefficient_group + coefficient_counter++];
                    int c;
                    STBIR_ASSERT(coefficient != 0);
                    for (c = 0; c < channels; c++)
                        output_buffer[out_pixel_index + c] += decode_buffer[in_pixel_index + c] * coefficient;
                }
                break;
        }
    }
}